

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

int __thiscall
DnsStats::SubmitName
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,bool should_tabulate)

{
  byte *pbVar1;
  byte bVar2;
  
  if (start < length) {
    while( true ) {
      bVar2 = packet[start];
      if (bVar2 == 0) {
        if (should_tabulate) {
          SubmitRegistryNumberAndCount(this,7,0,1);
        }
        return start + 1;
      }
      if ((~bVar2 & 0xc0) == 0) break;
      if (0x3f < bVar2) {
        *(byte *)&this->error_flags = (byte)this->error_flags | 0x80;
        if (!should_tabulate) {
          return length;
        }
        SubmitRegistryNumberAndCount(this,7,(uint)bVar2,1);
        return length;
      }
      if (should_tabulate) {
        SubmitRegistryNumberAndCount(this,7,0,1);
      }
      start = start + bVar2 + 1;
      if (length < start) goto LAB_0015db49;
      if (length <= start) {
        return start;
      }
    }
    if (should_tabulate) {
      SubmitRegistryNumberAndCount(this,7,0xc0,1);
    }
    start = start + 2;
    if (length < start) {
LAB_0015db49:
      pbVar1 = (byte *)((long)&this->error_flags + 1);
      *pbVar1 = *pbVar1 | 1;
      start = length;
    }
  }
  return start;
}

Assistant:

int DnsStats::SubmitName(uint8_t * packet, uint32_t length, uint32_t start, bool should_tabulate)
{
    uint32_t l = 0;

    while (start < length)
    {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0);
            }
            start++;
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            /* Name compression */
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0xC0);
            }

            if ((start + 2) > length)
            {
                error_flags |= DNS_REGISTRY_ERROR_FORMAT;
                start = length;
                break;
            }
            else
            {
                start += 2;
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            error_flags |= DNS_REGISTRY_ERROR_LABEL;
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, l);
            }
            start = length;
            break;
        }
        else
        {
            /* regular name part. To do: tracking of underscore labels. */
            if (should_tabulate)
            {
                SubmitRegistryNumber(REGISTRY_DNS_LabelType, 0);
            }
            if (start + l + 1 > length)
            {
                error_flags |= DNS_REGISTRY_ERROR_FORMAT;
                start = length;
                break;
            }
            else
            {
                start += l + 1;
            }
        }
    }

    return start;
}